

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O0

bool slang::parsing::isSameTokenList(TokenList *left,TokenList *right)

{
  bool bVar1;
  span<slang::parsing::Token,_18446744073709551615UL> *this;
  span<slang::parsing::Token,_18446744073709551615UL> *psVar2;
  undefined1 in_stack_00000030 [16];
  iterator rit;
  iterator lit;
  __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
  in_stack_ffffffffffffffa0;
  int iVar3;
  __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
  in_stack_ffffffffffffffa8;
  __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
  local_28;
  __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
  local_20 [3];
  bool local_1;
  
  this = (span<slang::parsing::Token,_18446744073709551615UL> *)
         std::span<slang::parsing::Token,_18446744073709551615UL>::size
                   ((span<slang::parsing::Token,_18446744073709551615UL> *)0x2dac2c);
  psVar2 = (span<slang::parsing::Token,_18446744073709551615UL> *)
           std::span<slang::parsing::Token,_18446744073709551615UL>::size
                     ((span<slang::parsing::Token,_18446744073709551615UL> *)0x2dac3e);
  if (this == psVar2) {
    local_20[0]._M_current =
         (Token *)std::span<slang::parsing::Token,_18446744073709551615UL>::begin(this);
    local_28._M_current =
         (Token *)std::span<slang::parsing::Token,_18446744073709551615UL>::begin(this);
    while( true ) {
      std::span<slang::parsing::Token,_18446744073709551615UL>::end
                ((span<slang::parsing::Token,_18446744073709551615UL> *)
                 in_stack_ffffffffffffffa8._M_current);
      bVar1 = __gnu_cxx::
              operator==<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                        ((__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                          *)in_stack_ffffffffffffffa0._M_current,
                         (__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                          *)this);
      iVar3 = (int)((ulong)in_stack_ffffffffffffffa0._M_current >> 0x20);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      __gnu_cxx::
      __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
      ::operator*(local_20);
      __gnu_cxx::
      __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
      ::operator*(&local_28);
      bVar1 = isSameToken(_rit,(Token)in_stack_00000030);
      if (!bVar1) {
        return false;
      }
      in_stack_ffffffffffffffa8 =
           __gnu_cxx::
           __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
           ::operator++(in_stack_ffffffffffffffa8._M_current,iVar3);
      in_stack_ffffffffffffffa0 =
           __gnu_cxx::
           __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
           ::operator++(in_stack_ffffffffffffffa8._M_current,iVar3);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool isSameTokenList(const TokenList& left, const TokenList& right) {
    if (left.size() != right.size())
        return false;

    for (auto lit = left.begin(), rit = right.begin(); lit != left.end(); lit++, rit++) {
        if (!isSameToken(*lit, *rit))
            return false;
    }
    return true;
}